

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"performance float");
  std::endl<char,std::char_traits<char>>(poVar1);
  benchmark<float>(8,0x20,0x10);
  poVar1 = std::operator<<((ostream *)&std::cout,"performance double");
  std::endl<char,std::char_traits<char>>(poVar1);
  benchmark<double>(8,0x20,0x10);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
	std::cout<<"performance float"<<std::endl;
	benchmark<float>(8,32,16);
	std::cout<<"performance double"<<std::endl;
	benchmark<double>(8,32,16);
}